

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O2

int tractor_beam_x2_proc(Am_Object *self)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Am_Value *pAVar6;
  Am_Object tb_dest_bitmap;
  Am_Object tb_dest;
  
  pAVar6 = (Am_Value *)Am_Object::Get((ushort)self,(ulong)TB_DEST);
  Am_Object::Am_Object(&tb_dest,pAVar6);
  pAVar6 = (Am_Value *)Am_Object::Get((ushort)&tb_dest,(ulong)SHIP_BITMAP);
  Am_Object::Am_Object(&tb_dest_bitmap,pAVar6);
  pAVar6 = (Am_Value *)Am_Object::Get((ushort)&tb_dest,100);
  iVar1 = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = (Am_Value *)Am_Object::Get((ushort)&tb_dest_bitmap,100);
  iVar2 = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = (Am_Value *)Am_Object::Get((ushort)&tb_dest_bitmap,0x66);
  iVar3 = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = (Am_Value *)Am_Object::Get((ushort)&tb_dest,0x65);
  iVar4 = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = (Am_Value *)Am_Object::Get((ushort)&tb_dest_bitmap,0x67);
  iVar5 = Am_Value::operator_cast_to_int(pAVar6);
  Am_Object::Set((ushort)self,0x8e,(ulong)(uint)(iVar4 + iVar5 / 2));
  Am_Object::~Am_Object(&tb_dest_bitmap);
  Am_Object::~Am_Object(&tb_dest);
  return iVar3 / 2 + iVar2 + iVar1;
}

Assistant:

Am_Define_Formula(int, tractor_beam_x2)
{
  Am_Object tb_dest = (Am_Object)(self.Get(TB_DEST));
  Am_Object tb_dest_bitmap = (Am_Object)(tb_dest.Get(SHIP_BITMAP));
  int tb_dest_x =
      ((int)(tb_dest.Get(Am_LEFT)) + (int)(tb_dest_bitmap.Get(Am_LEFT)) +
       ((int)(tb_dest_bitmap.Get(Am_WIDTH)) / 2));
  int tb_dest_y =
      ((int)(tb_dest.Get(Am_TOP)) + ((int)(tb_dest_bitmap.Get(Am_HEIGHT)) / 2));
  self.Set(Am_Y2, tb_dest_y);
  //self.Set(Am_X2, tb_dest_x);//** NEEDED FOR NO APPARENT REASON BY PC VERSION
  return (tb_dest_x);
}